

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_zero_copy_stream.h
# Opt level: O2

bool __thiscall
google::protobuf::io::internal::TestZeroCopyInputStream::Skip
          (TestZeroCopyInputStream *this,int count)

{
  int iVar1;
  Nullable<const_char_*> failure_msg;
  reference this_00;
  bool bVar2;
  LogMessage local_50 [2];
  
  failure_msg = absl::lts_20250127::log_internal::Check_GEImpl(count,0,"count >= 0");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/test_zero_copy_stream.h"
               ,0x4f,failure_msg);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (local_50,(char (*) [27])"count must not be negative");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_50)
    ;
  }
  std::
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reset((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&this->last_returned_buffer_,(pointer)0x0);
  while( true ) {
    bVar2 = count == 0;
    if (bVar2) {
      return bVar2;
    }
    if ((this->buffers_).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->buffers_).
        super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    this_00 = std::
              _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ::operator[](&(this->buffers_).
                            super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Deque_impl_data._M_start,0);
    iVar1 = (int)this_00->_M_string_length;
    if (count < iVar1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)this_00);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
      this->byte_count_ = this->byte_count_ + (long)count;
      return true;
    }
    this->byte_count_ = this->byte_count_ + (long)iVar1;
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_front(&this->buffers_);
    count = count - iVar1;
  }
  return bVar2;
}

Assistant:

bool Skip(int count) override {
    ABSL_CHECK_GE(count, 0) << "count must not be negative";
    last_returned_buffer_ = nullptr;
    while (true) {
      if (count == 0) return true;
      if (buffers_.empty()) return false;
      auto& front = buffers_[0];
      int front_size = static_cast<int>(front.size());
      if (front_size <= count) {
        count -= front_size;
        byte_count_ += front_size;
        buffers_.pop_front();
      } else {
        // The front is enough, just chomp from it.
        front = front.substr(count);
        byte_count_ += count;
        return true;
      }
    }
  }